

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O1

bool llama_model_load(string *fname,llama_model *model,gpt_vocab *vocab,int n_ctx)

{
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  ggml_type gVar1;
  _Rb_tree_color _Var2;
  mapped_type pgVar3;
  pointer pcVar4;
  void *pvVar5;
  mapped_type mVar6;
  int32_t iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  void *__s;
  mapped_type *pmVar13;
  mapped_type *this_00;
  ggml_context *pgVar14;
  ggml_tensor *pgVar15;
  mapped_type *ppgVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  size_t sVar18;
  size_t sVar19;
  long lVar20;
  iterator iVar21;
  size_type sVar22;
  ulong uVar23;
  ulong uVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  int32_t *piVar26;
  int iVar27;
  int *piVar28;
  uint uVar29;
  int iVar30;
  FILE *__stream;
  llama_hparams *hparams;
  value_type *__val;
  pointer plVar31;
  long lVar32;
  llama_model *plVar33;
  long lVar34;
  _Alloc_hider _Var35;
  bool bVar36;
  float fVar37;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  ggml_init_params params;
  string fname_part;
  int32_t n_dims;
  uint32_t len;
  size_type local_5a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_598;
  int32_t ne [2];
  allocator<char> local_579;
  ulong local_578;
  ulong local_570;
  undefined8 local_568;
  undefined8 local_558;
  float local_53c;
  llama_model *local_538;
  int32_t length;
  undefined8 local_528;
  string *local_510;
  undefined8 local_508;
  float local_4f8;
  float local_4f4;
  int local_4f0;
  int32_t ftype;
  key_type local_4e8;
  undefined8 local_4c8;
  undefined8 local_4b8;
  string __str_8;
  uint32_t magic;
  size_type local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470 [31];
  float local_278;
  undefined4 uStack_274;
  float local_268;
  undefined4 uStack_264;
  undefined8 local_258;
  undefined8 local_248;
  ifstream fin;
  long local_228 [2];
  byte abStack_218 [488];
  
  local_568 = vocab;
  fprintf(_stderr,"%s: loading model from \'%s\' - please wait ...\n","llama_model_load",
          (fname->_M_dataplus)._M_p);
  __s = operator_new(0x100000);
  memset(__s,0,0x100000);
  local_510 = fname;
  std::ifstream::ifstream(&fin,(string *)fname,_S_bin);
  (**(code **)(local_228[0] + 0x18))(local_228,__s,0x100000);
  if ((abStack_218[*(long *)(_fin + -0x18)] & 5) == 0) {
    std::istream::read((char *)&fin,(long)&magic);
    if (magic != 0x67676d6c) {
      bVar36 = false;
      fprintf(_stderr,"%s: invalid model file \'%s\' (bad magic)\n","llama_model_load",
              (local_510->_M_dataplus)._M_p);
      goto LAB_0010c135;
    }
    std::istream::read((char *)&fin,(long)model);
    piVar26 = &(model->hparams).n_embd;
    std::istream::read((char *)&fin,(long)piVar26);
    std::istream::read((char *)&fin,(long)&(model->hparams).n_mult);
    std::istream::read((char *)&fin,(long)&(model->hparams).n_head);
    std::istream::read((char *)&fin,(long)&(model->hparams).n_layer);
    std::istream::read((char *)&fin,(long)&(model->hparams).n_rot);
    local_558 = &(model->hparams).f16;
    std::istream::read((char *)&fin,(long)local_558);
    (model->hparams).n_ctx = n_ctx;
    local_4f0 = (model->hparams).n_mult;
    uVar8 = (((model->hparams).n_embd << 3) / 3 + local_4f0) - 1;
    local_570 = (ulong)uVar8;
    local_4f0 = (int)uVar8 % local_4f0;
    pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                        (&LLAMA_N_PARTS,piVar26);
    local_578 = (ulong)*pmVar13;
    iVar30 = (model->hparams).n_vocab;
    _magic = (pointer)local_470;
    local_478 = 0;
    local_470[0]._M_allocated_capacity = local_470[0]._M_allocated_capacity & 0xffffffffffffff00;
    fname_part._M_dataplus._M_p = (pointer)((ulong)fname_part._M_dataplus._M_p._4_4_ << 0x20);
    local_538 = model;
    if (0 < iVar30) {
      this = &local_568->id_to_token;
      do {
        std::istream::read((char *)&fin,(long)&len);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&magic,
                   (ulong)_len & 0xffffffff,'\0');
        std::istream::read((char *)&fin,(long)_magic);
        mVar6 = (mapped_type)fname_part._M_dataplus._M_p;
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::operator[](&local_568->token_to_id,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &magic);
        *pmVar13 = mVar6;
        this_00 = std::
                  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this,(key_type *)&fname_part);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &magic);
        iVar9 = (mapped_type)fname_part._M_dataplus._M_p + 1;
        fname_part._M_dataplus._M_p._0_4_ = iVar9;
      } while (iVar9 < iVar30);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_magic != local_470) {
      operator_delete(_magic,local_470[0]._M_allocated_capacity + 1);
    }
    if (3 < (ulong)(uint)*local_558) {
      bVar36 = false;
      fprintf(_stderr,"%s: invalid model file \'%s\' (bad f16 value %d)\n","llama_model_load",
              (local_510->_M_dataplus)._M_p);
      goto LAB_0010c135;
    }
    gVar1 = *(ggml_type *)(&DAT_00133080 + (ulong)(uint)*local_558 * 4);
    iVar30 = (local_538->hparams).n_ctx;
    iVar9 = (local_538->hparams).n_embd;
    iVar27 = (local_538->hparams).n_layer;
    _Var2 = (local_538->hparams).n_vocab;
    local_4f4 = ggml_type_sizef(gVar1);
    fVar37 = ggml_type_sizef(GGML_TYPE_F32);
    local_248 = CONCAT44(extraout_XMM0_Db,fVar37);
    local_4f8 = ggml_type_sizef(gVar1);
    local_568._0_4_ = ggml_type_sizef(GGML_TYPE_F32);
    local_568._4_4_ = extraout_XMM0_Db_00;
    local_558._0_4_ = ggml_type_sizef(gVar1);
    local_558._4_4_ = extraout_XMM0_Db_01;
    local_528._0_4_ = ggml_type_sizef(gVar1);
    local_528._4_4_ = extraout_XMM0_Db_02;
    local_508._0_4_ = ggml_type_sizef(gVar1);
    local_508._4_4_ = extraout_XMM0_Db_03;
    local_4b8._0_4_ = ggml_type_sizef(gVar1);
    local_4b8._4_4_ = extraout_XMM0_Db_04;
    local_4c8._0_4_ = ggml_type_sizef(GGML_TYPE_F32);
    local_4c8._4_4_ = extraout_XMM0_Db_05;
    local_268 = ggml_type_sizef(gVar1);
    uStack_264 = extraout_XMM0_Db_06;
    local_278 = ggml_type_sizef(gVar1);
    uStack_274 = extraout_XMM0_Db_07;
    local_53c = ggml_type_sizef(gVar1);
    fVar37 = ggml_type_sizef(GGML_TYPE_F32);
    local_258 = CONCAT44(extraout_XMM0_Db_08,fVar37);
    fVar37 = ggml_type_sizef(GGML_TYPE_F32);
    plVar33 = local_538;
    fVar44 = (float)(int)(_Var2 * iVar9);
    fVar41 = (float)iVar9;
    fVar40 = local_4f4 * fVar44 + 0.0;
    uVar23 = (ulong)fVar40;
    fVar42 = (float)local_248 * fVar41 +
             (float)((long)(fVar40 - 9.223372e+18) & (long)uVar23 >> 0x3f | uVar23);
    uVar23 = (ulong)fVar42;
    fVar43 = (float)(iVar9 * iVar9);
    fVar40 = (float)iVar27;
    fVar42 = fVar44 * local_4f8 +
             (float)((long)(fVar42 - 9.223372e+18) & (long)uVar23 >> 0x3f | uVar23);
    uVar23 = (ulong)fVar42;
    local_568._0_4_ = (float)local_568 * fVar41;
    fVar42 = (float)local_568 * fVar40 +
             (float)((long)(fVar42 - 9.223372e+18) & (long)uVar23 >> 0x3f | uVar23);
    uVar23 = (ulong)fVar42;
    local_558._0_4_ = (float)local_558 * fVar43;
    fVar42 = (float)local_558 * fVar40 +
             (float)((long)(fVar42 - 9.223372e+18) & (long)uVar23 >> 0x3f | uVar23);
    uVar23 = (ulong)fVar42;
    local_528._0_4_ = (float)local_528 * fVar43;
    uVar8 = (int)local_570 - local_4f0;
    local_570 = (ulong)uVar8;
    fVar42 = (float)local_528 * fVar40 +
             (float)((long)(fVar42 - 9.223372e+18) & (long)uVar23 >> 0x3f | uVar23);
    uVar23 = (ulong)fVar42;
    local_508._0_4_ = (float)local_508 * fVar43;
    fVar44 = (float)local_508 * fVar40 +
             (float)((long)(fVar42 - 9.223372e+18) & (long)uVar23 >> 0x3f | uVar23);
    uVar23 = (ulong)fVar44;
    local_4b8._0_4_ = (float)local_4b8 * fVar43;
    fVar42 = (float)(int)(iVar9 * uVar8);
    fVar43 = (float)local_4b8 * fVar40 +
             (float)((long)(fVar44 - 9.223372e+18) & (long)uVar23 >> 0x3f | uVar23);
    uVar23 = (ulong)fVar43;
    local_4c8._0_4_ = (float)local_4c8 * fVar41;
    fVar41 = (float)local_4c8 * fVar40 +
             (float)((long)(fVar43 - 9.223372e+18) & (long)uVar23 >> 0x3f | uVar23);
    uVar23 = (ulong)fVar41;
    local_268 = local_268 * fVar42;
    fVar41 = local_268 * fVar40 +
             (float)((long)(fVar41 - 9.223372e+18) & (long)uVar23 >> 0x3f | uVar23);
    uVar23 = (ulong)fVar41;
    local_278 = local_278 * fVar42;
    fVar43 = local_278 * fVar40 +
             (float)((long)(fVar41 - 9.223372e+18) & (long)uVar23 >> 0x3f | uVar23);
    uVar23 = (ulong)fVar43;
    local_53c = local_53c * fVar42;
    fVar41 = (float)(iVar9 * iVar27 * iVar30);
    fVar40 = fVar40 * local_53c +
             (float)((long)(fVar43 - 9.223372e+18) & (long)uVar23 >> 0x3f | uVar23);
    uVar23 = (ulong)fVar40;
    fVar40 = (float)local_258 * fVar41 +
             (float)((long)(fVar40 - 9.223372e+18) & (long)uVar23 >> 0x3f | uVar23);
    uVar23 = (ulong)fVar40;
    fVar37 = fVar41 * fVar37 +
             (float)((long)(fVar40 - 9.223372e+18) & (long)uVar23 >> 0x3f | uVar23);
    uVar23 = (ulong)fVar37;
    uVar23 = (long)(iVar27 * 0xa00 + 0x500) +
             ((long)(fVar37 - 9.223372e+18) & (long)uVar23 >> 0x3f | uVar23);
    auVar38._8_4_ = (int)(uVar23 >> 0x20);
    auVar38._0_8_ = uVar23;
    auVar38._12_4_ = 0x45300000;
    fprintf(_stderr,"%s: ggml ctx size = %6.2f MB\n",
            SUB84(((auVar38._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar23) - 4503599627370496.0)) *
                  9.5367431640625e-07,0),"llama_model_load");
    params.mem_buffer = (void *)0x0;
    params.mem_size = uVar23;
    pgVar14 = ggml_init(params);
    plVar33->ctx = pgVar14;
    if (pgVar14 != (ggml_context *)0x0) {
      local_558 = (int32_t *)CONCAT44(local_558._4_4_,gVar1);
      _Var2 = (plVar33->hparams).n_vocab;
      iVar30 = (plVar33->hparams).n_embd;
      local_528 = (ulong)(plVar33->hparams).n_layer;
      std::vector<llama_layer,_std::allocator<llama_layer>_>::resize(&plVar33->layers,local_528);
      pgVar15 = ggml_new_tensor_2d(plVar33->ctx,(ggml_type)(float)local_558,iVar30,_Var2);
      plVar33->tok_embeddings = pgVar15;
      pgVar15 = ggml_new_tensor_1d(plVar33->ctx,GGML_TYPE_F32,iVar30);
      plVar33->norm = pgVar15;
      pgVar15 = ggml_new_tensor_2d(plVar33->ctx,(ggml_type)(float)local_558,iVar30,_Var2);
      plVar33->output = pgVar15;
      pgVar3 = plVar33->tok_embeddings;
      _magic = (pointer)local_470;
      std::__cxx11::string::_M_construct<char_const*>((string *)&magic,"tok_embeddings.weight","");
      local_568 = (gpt_vocab *)&plVar33->tensors;
      ppgVar16 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                               *)local_568,(key_type *)&magic);
      *ppgVar16 = pgVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_magic != local_470) {
        operator_delete(_magic,local_470[0]._M_allocated_capacity + 1);
      }
      pgVar3 = plVar33->norm;
      _magic = (pointer)local_470;
      std::__cxx11::string::_M_construct<char_const*>((string *)&magic,"norm.weight","");
      ppgVar16 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                               *)local_568,(key_type *)&magic);
      *ppgVar16 = pgVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_magic != local_470) {
        operator_delete(_magic,local_470[0]._M_allocated_capacity + 1);
      }
      pgVar3 = plVar33->output;
      _magic = (pointer)local_470;
      std::__cxx11::string::_M_construct<char_const*>((string *)&magic,"output.weight","");
      ppgVar16 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                               *)local_568,(key_type *)&magic);
      *ppgVar16 = pgVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_magic != local_470) {
        operator_delete(_magic,local_470[0]._M_allocated_capacity + 1);
      }
      if (0 < (int)(float)local_528) {
        uVar23 = 0;
        local_508 = CONCAT44(local_508._4_4_,iVar30);
        do {
          plVar31 = (plVar33->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar23;
          pgVar15 = ggml_new_tensor_1d(plVar33->ctx,GGML_TYPE_F32,iVar30);
          gVar1 = (ggml_type)(float)local_558;
          plVar31->attention_norm = pgVar15;
          pgVar15 = ggml_new_tensor_2d(plVar33->ctx,(ggml_type)(float)local_558,iVar30,iVar30);
          plVar31->wq = pgVar15;
          pgVar15 = ggml_new_tensor_2d(plVar33->ctx,gVar1,iVar30,iVar30);
          plVar31->wk = pgVar15;
          pgVar15 = ggml_new_tensor_2d(plVar33->ctx,gVar1,iVar30,iVar30);
          plVar31->wv = pgVar15;
          pgVar15 = ggml_new_tensor_2d(plVar33->ctx,gVar1,iVar30,iVar30);
          plVar31->wo = pgVar15;
          pgVar15 = ggml_new_tensor_1d(plVar33->ctx,GGML_TYPE_F32,iVar30);
          plVar31->ffn_norm = pgVar15;
          pgVar15 = ggml_new_tensor_2d(plVar33->ctx,gVar1,iVar30,(int)local_570);
          plVar31->w1 = pgVar15;
          pgVar15 = ggml_new_tensor_2d(plVar33->ctx,gVar1,(int)local_570,iVar30);
          plVar31->w2 = pgVar15;
          pgVar15 = ggml_new_tensor_2d(plVar33->ctx,gVar1,iVar30,(int)local_570);
          plVar31->w3 = pgVar15;
          uVar29 = 1;
          _len = (pointer)&local_598;
          uVar8 = (uint)uVar23;
          if (9 < uVar23) {
            uVar11 = 4;
            uVar24 = uVar23;
            do {
              uVar29 = uVar11;
              uVar10 = (uint)uVar24;
              if (uVar10 < 100) {
                uVar29 = uVar29 - 2;
                goto LAB_0010a7dc;
              }
              if (uVar10 < 1000) {
                uVar29 = uVar29 - 1;
                goto LAB_0010a7dc;
              }
              if (uVar10 < 10000) goto LAB_0010a7dc;
              uVar24 = (uVar24 & 0xffffffff) / 10000;
              uVar11 = uVar29 + 4;
            } while (99999 < uVar10);
            uVar29 = uVar29 + 1;
          }
LAB_0010a7dc:
          pgVar3 = plVar31->attention_norm;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len,
                       (ulong)uVar29,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>(_len,uVar29,uVar8);
          pbVar17 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &len,0,0,"layers.",7);
          fname_part._M_dataplus._M_p = (pointer)&fname_part.field_2;
          pcVar4 = (pbVar17->_M_dataplus)._M_p;
          paVar25 = &pbVar17->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 == paVar25) {
            fname_part.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
            fname_part.field_2._8_8_ = *(undefined8 *)((long)&pbVar17->field_2 + 8);
          }
          else {
            fname_part.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
            fname_part._M_dataplus._M_p = pcVar4;
          }
          fname_part._M_string_length = pbVar17->_M_string_length;
          (pbVar17->_M_dataplus)._M_p = (pointer)paVar25;
          pbVar17->_M_string_length = 0;
          (pbVar17->field_2)._M_local_buf[0] = '\0';
          pbVar17 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&fname_part,".attention_norm.weight");
          _magic = (pbVar17->_M_dataplus)._M_p;
          paVar25 = &pbVar17->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic == paVar25) {
            local_470[0]._0_8_ = paVar25->_M_allocated_capacity;
            local_470[0]._8_8_ = *(undefined8 *)((long)&pbVar17->field_2 + 8);
            _magic = (pointer)local_470;
          }
          else {
            local_470[0]._0_8_ = paVar25->_M_allocated_capacity;
          }
          local_478 = pbVar17->_M_string_length;
          (pbVar17->_M_dataplus)._M_p = (pointer)paVar25;
          pbVar17->_M_string_length = 0;
          (pbVar17->field_2)._M_local_buf[0] = '\0';
          ppgVar16 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_568,(key_type *)&magic);
          *ppgVar16 = pgVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic != local_470) {
            operator_delete(_magic,local_470[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fname_part._M_dataplus._M_p != &fname_part.field_2) {
            operator_delete(fname_part._M_dataplus._M_p,fname_part.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_len != &local_598) {
            operator_delete(_len,local_598._M_allocated_capacity + 1);
          }
          _len = (pointer)&local_598;
          pgVar3 = plVar31->wq;
          uVar29 = 1;
          if (9 < uVar23) {
            uVar11 = 4;
            uVar24 = uVar23;
            do {
              uVar29 = uVar11;
              uVar10 = (uint)uVar24;
              if (uVar10 < 100) {
                uVar29 = uVar29 - 2;
                goto LAB_0010a98a;
              }
              if (uVar10 < 1000) {
                uVar29 = uVar29 - 1;
                goto LAB_0010a98a;
              }
              if (uVar10 < 10000) goto LAB_0010a98a;
              uVar24 = (uVar24 & 0xffffffff) / 10000;
              uVar11 = uVar29 + 4;
            } while (99999 < uVar10);
            uVar29 = uVar29 + 1;
          }
LAB_0010a98a:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len,
                       (ulong)uVar29,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>(_len,uVar29,uVar8);
          pbVar17 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &len,0,0,"layers.",7);
          fname_part._M_dataplus._M_p = (pointer)&fname_part.field_2;
          pcVar4 = (pbVar17->_M_dataplus)._M_p;
          paVar25 = &pbVar17->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 == paVar25) {
            fname_part.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
            fname_part.field_2._8_8_ = *(undefined8 *)((long)&pbVar17->field_2 + 8);
          }
          else {
            fname_part.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
            fname_part._M_dataplus._M_p = pcVar4;
          }
          fname_part._M_string_length = pbVar17->_M_string_length;
          (pbVar17->_M_dataplus)._M_p = (pointer)paVar25;
          pbVar17->_M_string_length = 0;
          (pbVar17->field_2)._M_local_buf[0] = '\0';
          pbVar17 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&fname_part,".attention.wq.weight");
          _magic = (pbVar17->_M_dataplus)._M_p;
          paVar25 = &pbVar17->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic == paVar25) {
            local_470[0]._0_8_ = paVar25->_M_allocated_capacity;
            local_470[0]._8_8_ = *(undefined8 *)((long)&pbVar17->field_2 + 8);
            _magic = (pointer)local_470;
          }
          else {
            local_470[0]._0_8_ = paVar25->_M_allocated_capacity;
          }
          local_478 = pbVar17->_M_string_length;
          (pbVar17->_M_dataplus)._M_p = (pointer)paVar25;
          pbVar17->_M_string_length = 0;
          (pbVar17->field_2)._M_local_buf[0] = '\0';
          ppgVar16 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_568,(key_type *)&magic);
          *ppgVar16 = pgVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic != local_470) {
            operator_delete(_magic,local_470[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fname_part._M_dataplus._M_p != &fname_part.field_2) {
            operator_delete(fname_part._M_dataplus._M_p,fname_part.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_len != &local_598) {
            operator_delete(_len,local_598._M_allocated_capacity + 1);
          }
          _len = (pointer)&local_598;
          pgVar3 = plVar31->wk;
          uVar29 = 1;
          if (9 < uVar23) {
            uVar11 = 4;
            uVar24 = uVar23;
            do {
              uVar29 = uVar11;
              uVar10 = (uint)uVar24;
              if (uVar10 < 100) {
                uVar29 = uVar29 - 2;
                goto LAB_0010ab35;
              }
              if (uVar10 < 1000) {
                uVar29 = uVar29 - 1;
                goto LAB_0010ab35;
              }
              if (uVar10 < 10000) goto LAB_0010ab35;
              uVar24 = (uVar24 & 0xffffffff) / 10000;
              uVar11 = uVar29 + 4;
            } while (99999 < uVar10);
            uVar29 = uVar29 + 1;
          }
LAB_0010ab35:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len,
                       (ulong)uVar29,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>(_len,uVar29,uVar8);
          pbVar17 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &len,0,0,"layers.",7);
          fname_part._M_dataplus._M_p = (pointer)&fname_part.field_2;
          pcVar4 = (pbVar17->_M_dataplus)._M_p;
          paVar25 = &pbVar17->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 == paVar25) {
            fname_part.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
            fname_part.field_2._8_8_ = *(undefined8 *)((long)&pbVar17->field_2 + 8);
          }
          else {
            fname_part.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
            fname_part._M_dataplus._M_p = pcVar4;
          }
          fname_part._M_string_length = pbVar17->_M_string_length;
          (pbVar17->_M_dataplus)._M_p = (pointer)paVar25;
          pbVar17->_M_string_length = 0;
          (pbVar17->field_2)._M_local_buf[0] = '\0';
          pbVar17 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&fname_part,".attention.wk.weight");
          _magic = (pbVar17->_M_dataplus)._M_p;
          paVar25 = &pbVar17->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic == paVar25) {
            local_470[0]._0_8_ = paVar25->_M_allocated_capacity;
            local_470[0]._8_8_ = *(undefined8 *)((long)&pbVar17->field_2 + 8);
            _magic = (pointer)local_470;
          }
          else {
            local_470[0]._0_8_ = paVar25->_M_allocated_capacity;
          }
          local_478 = pbVar17->_M_string_length;
          (pbVar17->_M_dataplus)._M_p = (pointer)paVar25;
          pbVar17->_M_string_length = 0;
          (pbVar17->field_2)._M_local_buf[0] = '\0';
          ppgVar16 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_568,(key_type *)&magic);
          *ppgVar16 = pgVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic != local_470) {
            operator_delete(_magic,local_470[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fname_part._M_dataplus._M_p != &fname_part.field_2) {
            operator_delete(fname_part._M_dataplus._M_p,fname_part.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_len != &local_598) {
            operator_delete(_len,local_598._M_allocated_capacity + 1);
          }
          _len = (pointer)&local_598;
          pgVar3 = plVar31->wv;
          uVar29 = 1;
          if (9 < uVar23) {
            uVar11 = 4;
            uVar24 = uVar23;
            do {
              uVar29 = uVar11;
              uVar10 = (uint)uVar24;
              if (uVar10 < 100) {
                uVar29 = uVar29 - 2;
                goto LAB_0010ace0;
              }
              if (uVar10 < 1000) {
                uVar29 = uVar29 - 1;
                goto LAB_0010ace0;
              }
              if (uVar10 < 10000) goto LAB_0010ace0;
              uVar24 = (uVar24 & 0xffffffff) / 10000;
              uVar11 = uVar29 + 4;
            } while (99999 < uVar10);
            uVar29 = uVar29 + 1;
          }
LAB_0010ace0:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len,
                       (ulong)uVar29,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>(_len,uVar29,uVar8);
          pbVar17 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &len,0,0,"layers.",7);
          fname_part._M_dataplus._M_p = (pointer)&fname_part.field_2;
          pcVar4 = (pbVar17->_M_dataplus)._M_p;
          paVar25 = &pbVar17->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 == paVar25) {
            fname_part.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
            fname_part.field_2._8_8_ = *(undefined8 *)((long)&pbVar17->field_2 + 8);
          }
          else {
            fname_part.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
            fname_part._M_dataplus._M_p = pcVar4;
          }
          fname_part._M_string_length = pbVar17->_M_string_length;
          (pbVar17->_M_dataplus)._M_p = (pointer)paVar25;
          pbVar17->_M_string_length = 0;
          (pbVar17->field_2)._M_local_buf[0] = '\0';
          pbVar17 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&fname_part,".attention.wv.weight");
          _magic = (pbVar17->_M_dataplus)._M_p;
          paVar25 = &pbVar17->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic == paVar25) {
            local_470[0]._0_8_ = paVar25->_M_allocated_capacity;
            local_470[0]._8_8_ = *(undefined8 *)((long)&pbVar17->field_2 + 8);
            _magic = (pointer)local_470;
          }
          else {
            local_470[0]._0_8_ = paVar25->_M_allocated_capacity;
          }
          local_478 = pbVar17->_M_string_length;
          (pbVar17->_M_dataplus)._M_p = (pointer)paVar25;
          pbVar17->_M_string_length = 0;
          (pbVar17->field_2)._M_local_buf[0] = '\0';
          ppgVar16 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_568,(key_type *)&magic);
          *ppgVar16 = pgVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic != local_470) {
            operator_delete(_magic,local_470[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fname_part._M_dataplus._M_p != &fname_part.field_2) {
            operator_delete(fname_part._M_dataplus._M_p,fname_part.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_len != &local_598) {
            operator_delete(_len,local_598._M_allocated_capacity + 1);
          }
          _len = (pointer)&local_598;
          pgVar3 = plVar31->wo;
          uVar29 = 1;
          if (9 < uVar23) {
            uVar11 = 4;
            uVar24 = uVar23;
            do {
              uVar29 = uVar11;
              uVar10 = (uint)uVar24;
              if (uVar10 < 100) {
                uVar29 = uVar29 - 2;
                goto LAB_0010ae8b;
              }
              if (uVar10 < 1000) {
                uVar29 = uVar29 - 1;
                goto LAB_0010ae8b;
              }
              if (uVar10 < 10000) goto LAB_0010ae8b;
              uVar24 = (uVar24 & 0xffffffff) / 10000;
              uVar11 = uVar29 + 4;
            } while (99999 < uVar10);
            uVar29 = uVar29 + 1;
          }
LAB_0010ae8b:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len,
                       (ulong)uVar29,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>(_len,uVar29,uVar8);
          pbVar17 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &len,0,0,"layers.",7);
          fname_part._M_dataplus._M_p = (pointer)&fname_part.field_2;
          pcVar4 = (pbVar17->_M_dataplus)._M_p;
          paVar25 = &pbVar17->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 == paVar25) {
            fname_part.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
            fname_part.field_2._8_8_ = *(undefined8 *)((long)&pbVar17->field_2 + 8);
          }
          else {
            fname_part.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
            fname_part._M_dataplus._M_p = pcVar4;
          }
          fname_part._M_string_length = pbVar17->_M_string_length;
          (pbVar17->_M_dataplus)._M_p = (pointer)paVar25;
          pbVar17->_M_string_length = 0;
          (pbVar17->field_2)._M_local_buf[0] = '\0';
          pbVar17 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&fname_part,".attention.wo.weight");
          _magic = (pbVar17->_M_dataplus)._M_p;
          paVar25 = &pbVar17->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic == paVar25) {
            local_470[0]._0_8_ = paVar25->_M_allocated_capacity;
            local_470[0]._8_8_ = *(undefined8 *)((long)&pbVar17->field_2 + 8);
            _magic = (pointer)local_470;
          }
          else {
            local_470[0]._0_8_ = paVar25->_M_allocated_capacity;
          }
          local_478 = pbVar17->_M_string_length;
          (pbVar17->_M_dataplus)._M_p = (pointer)paVar25;
          pbVar17->_M_string_length = 0;
          (pbVar17->field_2)._M_local_buf[0] = '\0';
          ppgVar16 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_568,(key_type *)&magic);
          *ppgVar16 = pgVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic != local_470) {
            operator_delete(_magic,local_470[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fname_part._M_dataplus._M_p != &fname_part.field_2) {
            operator_delete(fname_part._M_dataplus._M_p,fname_part.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_len != &local_598) {
            operator_delete(_len,local_598._M_allocated_capacity + 1);
          }
          _len = (pointer)&local_598;
          pgVar3 = plVar31->ffn_norm;
          uVar29 = 1;
          if (9 < uVar23) {
            uVar11 = 4;
            uVar24 = uVar23;
            do {
              uVar29 = uVar11;
              uVar10 = (uint)uVar24;
              if (uVar10 < 100) {
                uVar29 = uVar29 - 2;
                goto LAB_0010b036;
              }
              if (uVar10 < 1000) {
                uVar29 = uVar29 - 1;
                goto LAB_0010b036;
              }
              if (uVar10 < 10000) goto LAB_0010b036;
              uVar24 = (uVar24 & 0xffffffff) / 10000;
              uVar11 = uVar29 + 4;
            } while (99999 < uVar10);
            uVar29 = uVar29 + 1;
          }
LAB_0010b036:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len,
                       (ulong)uVar29,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>(_len,uVar29,uVar8);
          pbVar17 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &len,0,0,"layers.",7);
          fname_part._M_dataplus._M_p = (pointer)&fname_part.field_2;
          pcVar4 = (pbVar17->_M_dataplus)._M_p;
          paVar25 = &pbVar17->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 == paVar25) {
            fname_part.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
            fname_part.field_2._8_8_ = *(undefined8 *)((long)&pbVar17->field_2 + 8);
          }
          else {
            fname_part.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
            fname_part._M_dataplus._M_p = pcVar4;
          }
          fname_part._M_string_length = pbVar17->_M_string_length;
          (pbVar17->_M_dataplus)._M_p = (pointer)paVar25;
          pbVar17->_M_string_length = 0;
          (pbVar17->field_2)._M_local_buf[0] = '\0';
          pbVar17 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&fname_part,".ffn_norm.weight");
          _magic = (pbVar17->_M_dataplus)._M_p;
          paVar25 = &pbVar17->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic == paVar25) {
            local_470[0]._0_8_ = paVar25->_M_allocated_capacity;
            local_470[0]._8_8_ = *(undefined8 *)((long)&pbVar17->field_2 + 8);
            _magic = (pointer)local_470;
          }
          else {
            local_470[0]._0_8_ = paVar25->_M_allocated_capacity;
          }
          local_478 = pbVar17->_M_string_length;
          (pbVar17->_M_dataplus)._M_p = (pointer)paVar25;
          pbVar17->_M_string_length = 0;
          (pbVar17->field_2)._M_local_buf[0] = '\0';
          ppgVar16 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_568,(key_type *)&magic);
          *ppgVar16 = pgVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic != local_470) {
            operator_delete(_magic,local_470[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fname_part._M_dataplus._M_p != &fname_part.field_2) {
            operator_delete(fname_part._M_dataplus._M_p,fname_part.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_len != &local_598) {
            operator_delete(_len,local_598._M_allocated_capacity + 1);
          }
          _len = (pointer)&local_598;
          pgVar3 = plVar31->w1;
          uVar29 = 1;
          if (9 < uVar23) {
            uVar11 = 4;
            uVar24 = uVar23;
            do {
              uVar29 = uVar11;
              uVar10 = (uint)uVar24;
              if (uVar10 < 100) {
                uVar29 = uVar29 - 2;
                goto LAB_0010b1e1;
              }
              if (uVar10 < 1000) {
                uVar29 = uVar29 - 1;
                goto LAB_0010b1e1;
              }
              if (uVar10 < 10000) goto LAB_0010b1e1;
              uVar24 = (uVar24 & 0xffffffff) / 10000;
              uVar11 = uVar29 + 4;
            } while (99999 < uVar10);
            uVar29 = uVar29 + 1;
          }
LAB_0010b1e1:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len,
                       (ulong)uVar29,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>(_len,uVar29,uVar8);
          pbVar17 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &len,0,0,"layers.",7);
          fname_part._M_dataplus._M_p = (pointer)&fname_part.field_2;
          pcVar4 = (pbVar17->_M_dataplus)._M_p;
          paVar25 = &pbVar17->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 == paVar25) {
            fname_part.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
            fname_part.field_2._8_8_ = *(undefined8 *)((long)&pbVar17->field_2 + 8);
          }
          else {
            fname_part.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
            fname_part._M_dataplus._M_p = pcVar4;
          }
          fname_part._M_string_length = pbVar17->_M_string_length;
          (pbVar17->_M_dataplus)._M_p = (pointer)paVar25;
          pbVar17->_M_string_length = 0;
          (pbVar17->field_2)._M_local_buf[0] = '\0';
          pbVar17 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&fname_part,".feed_forward.w1.weight");
          _magic = (pbVar17->_M_dataplus)._M_p;
          paVar25 = &pbVar17->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic == paVar25) {
            local_470[0]._0_8_ = paVar25->_M_allocated_capacity;
            local_470[0]._8_8_ = *(undefined8 *)((long)&pbVar17->field_2 + 8);
            _magic = (pointer)local_470;
          }
          else {
            local_470[0]._0_8_ = paVar25->_M_allocated_capacity;
          }
          local_478 = pbVar17->_M_string_length;
          (pbVar17->_M_dataplus)._M_p = (pointer)paVar25;
          pbVar17->_M_string_length = 0;
          (pbVar17->field_2)._M_local_buf[0] = '\0';
          ppgVar16 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_568,(key_type *)&magic);
          *ppgVar16 = pgVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic != local_470) {
            operator_delete(_magic,local_470[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fname_part._M_dataplus._M_p != &fname_part.field_2) {
            operator_delete(fname_part._M_dataplus._M_p,fname_part.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_len != &local_598) {
            operator_delete(_len,local_598._M_allocated_capacity + 1);
          }
          _len = (pointer)&local_598;
          pgVar3 = plVar31->w2;
          uVar29 = 1;
          if (9 < uVar23) {
            uVar11 = 4;
            uVar24 = uVar23;
            do {
              uVar29 = uVar11;
              uVar10 = (uint)uVar24;
              if (uVar10 < 100) {
                uVar29 = uVar29 - 2;
                goto LAB_0010b38c;
              }
              if (uVar10 < 1000) {
                uVar29 = uVar29 - 1;
                goto LAB_0010b38c;
              }
              if (uVar10 < 10000) goto LAB_0010b38c;
              uVar24 = (uVar24 & 0xffffffff) / 10000;
              uVar11 = uVar29 + 4;
            } while (99999 < uVar10);
            uVar29 = uVar29 + 1;
          }
LAB_0010b38c:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len,
                       (ulong)uVar29,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>(_len,uVar29,uVar8);
          pbVar17 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &len,0,0,"layers.",7);
          fname_part._M_dataplus._M_p = (pointer)&fname_part.field_2;
          pcVar4 = (pbVar17->_M_dataplus)._M_p;
          paVar25 = &pbVar17->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 == paVar25) {
            fname_part.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
            fname_part.field_2._8_8_ = *(undefined8 *)((long)&pbVar17->field_2 + 8);
          }
          else {
            fname_part.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
            fname_part._M_dataplus._M_p = pcVar4;
          }
          fname_part._M_string_length = pbVar17->_M_string_length;
          (pbVar17->_M_dataplus)._M_p = (pointer)paVar25;
          pbVar17->_M_string_length = 0;
          (pbVar17->field_2)._M_local_buf[0] = '\0';
          pbVar17 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&fname_part,".feed_forward.w2.weight");
          _magic = (pbVar17->_M_dataplus)._M_p;
          paVar25 = &pbVar17->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic == paVar25) {
            local_470[0]._0_8_ = paVar25->_M_allocated_capacity;
            local_470[0]._8_8_ = *(undefined8 *)((long)&pbVar17->field_2 + 8);
            _magic = (pointer)local_470;
          }
          else {
            local_470[0]._0_8_ = paVar25->_M_allocated_capacity;
          }
          local_478 = pbVar17->_M_string_length;
          (pbVar17->_M_dataplus)._M_p = (pointer)paVar25;
          pbVar17->_M_string_length = 0;
          (pbVar17->field_2)._M_local_buf[0] = '\0';
          ppgVar16 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_568,(key_type *)&magic);
          *ppgVar16 = pgVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic != local_470) {
            operator_delete(_magic,local_470[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fname_part._M_dataplus._M_p != &fname_part.field_2) {
            operator_delete(fname_part._M_dataplus._M_p,fname_part.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_len != &local_598) {
            operator_delete(_len,local_598._M_allocated_capacity + 1);
          }
          _len = (pointer)&local_598;
          pgVar3 = plVar31->w3;
          uVar29 = 1;
          if (9 < uVar23) {
            uVar11 = 4;
            uVar24 = uVar23;
            do {
              uVar29 = uVar11;
              uVar10 = (uint)uVar24;
              if (uVar10 < 100) {
                uVar29 = uVar29 - 2;
                goto LAB_0010b537;
              }
              if (uVar10 < 1000) {
                uVar29 = uVar29 - 1;
                goto LAB_0010b537;
              }
              if (uVar10 < 10000) goto LAB_0010b537;
              uVar24 = (uVar24 & 0xffffffff) / 10000;
              uVar11 = uVar29 + 4;
            } while (99999 < uVar10);
            uVar29 = uVar29 + 1;
          }
LAB_0010b537:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len,
                       (ulong)uVar29,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>(_len,uVar29,uVar8);
          pbVar17 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &len,0,0,"layers.",7);
          plVar33 = local_538;
          fname_part._M_dataplus._M_p = (pbVar17->_M_dataplus)._M_p;
          paVar25 = &pbVar17->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fname_part._M_dataplus._M_p == paVar25) {
            fname_part.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
            fname_part.field_2._8_8_ = *(undefined8 *)((long)&pbVar17->field_2 + 8);
            fname_part._M_dataplus._M_p = (pointer)&fname_part.field_2;
          }
          else {
            fname_part.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
          }
          fname_part._M_string_length = pbVar17->_M_string_length;
          (pbVar17->_M_dataplus)._M_p = (pointer)paVar25;
          pbVar17->_M_string_length = 0;
          (pbVar17->field_2)._M_local_buf[0] = '\0';
          pbVar17 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&fname_part,".feed_forward.w3.weight");
          _magic = (pbVar17->_M_dataplus)._M_p;
          paVar25 = &pbVar17->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic == paVar25) {
            local_470[0]._0_8_ = paVar25->_M_allocated_capacity;
            local_470[0]._8_8_ = *(undefined8 *)((long)&pbVar17->field_2 + 8);
            _magic = (pointer)local_470;
          }
          else {
            local_470[0]._0_8_ = paVar25->_M_allocated_capacity;
          }
          local_478 = pbVar17->_M_string_length;
          (pbVar17->_M_dataplus)._M_p = (pointer)paVar25;
          pbVar17->_M_string_length = 0;
          (pbVar17->field_2)._M_local_buf[0] = '\0';
          ppgVar16 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_568,(key_type *)&magic);
          *ppgVar16 = pgVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic != local_470) {
            operator_delete(_magic,local_470[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fname_part._M_dataplus._M_p != &fname_part.field_2) {
            operator_delete(fname_part._M_dataplus._M_p,fname_part.field_2._M_allocated_capacity + 1
                           );
          }
          iVar30 = (int)(float)local_508;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_len != &local_598) {
            operator_delete(_len,local_598._M_allocated_capacity + 1);
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != local_528);
      }
      uVar8 = (plVar33->hparams).n_ctx * (plVar33->hparams).n_layer;
      iVar30 = (plVar33->hparams).n_embd * uVar8;
      pgVar15 = ggml_new_tensor_1d(plVar33->ctx,GGML_TYPE_F32,iVar30);
      plVar33->memory_k = pgVar15;
      pgVar15 = ggml_new_tensor_1d(plVar33->ctx,GGML_TYPE_F32,iVar30);
      plVar33->memory_v = pgVar15;
      sVar18 = ggml_nbytes(plVar33->memory_k);
      sVar19 = ggml_nbytes(plVar33->memory_v);
      lVar20 = sVar19 + sVar18;
      auVar39._8_4_ = (int)((ulong)lVar20 >> 0x20);
      auVar39._0_8_ = lVar20;
      auVar39._12_4_ = 0x45300000;
      fprintf(_stderr,"%s: memory_size = %8.2f MB, n_mem = %d\n",
              SUB84(((auVar39._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar20) - 4503599627370496.0)) * 0.0009765625
                    * 0.0009765625,0),"llama_model_load",(ulong)uVar8);
      local_4b8 = std::istream::tellg();
      std::ifstream::close();
      local_538 = (llama_model *)&(plVar33->tensors)._M_t._M_impl.super__Rb_tree_header;
      uVar23 = 0;
      if (0 < (int)local_578) {
        uVar23 = local_578 & 0xffffffff;
      }
      piVar26 = (int32_t *)0x0;
      local_4c8 = CONCAT44(local_4c8._4_4_,(int)uVar23);
      do {
        local_558 = piVar26;
        if ((int)piVar26 == (int)uVar23) break;
        pcVar4 = (local_510->_M_dataplus)._M_p;
        fname_part._M_dataplus._M_p = (pointer)&fname_part.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&fname_part,pcVar4,pcVar4 + local_510->_M_string_length);
        uVar8 = (uint)local_558;
        if (uVar8 != 0) {
          uVar29 = 1;
          if (9 < uVar8) {
            piVar26 = local_558;
            uVar8 = 4;
            do {
              uVar29 = uVar8;
              uVar11 = (uint)piVar26;
              if (uVar11 < 100) {
                uVar29 = uVar29 - 2;
                goto LAB_0010b84c;
              }
              if (uVar11 < 1000) {
                uVar29 = uVar29 - 1;
                goto LAB_0010b84c;
              }
              if (uVar11 < 10000) goto LAB_0010b84c;
              piVar26 = (int32_t *)(((ulong)piVar26 & 0xffffffff) / 10000);
              uVar8 = uVar29 + 4;
            } while (99999 < uVar11);
            uVar29 = uVar29 + 1;
          }
LAB_0010b84c:
          __str_8._M_dataplus._M_p = (pointer)&__str_8.field_2;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct(&__str_8,(ulong)uVar29,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (__str_8._M_dataplus._M_p,uVar29,(uint)local_558);
          pbVar17 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace(&__str_8,0,0,".",1);
          _len = (pbVar17->_M_dataplus)._M_p;
          paVar25 = &pbVar17->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_len == paVar25) {
            local_598._M_allocated_capacity = paVar25->_M_allocated_capacity;
            local_598._8_8_ = *(undefined8 *)((long)&pbVar17->field_2 + 8);
            _len = (pointer)&local_598;
          }
          else {
            local_598._M_allocated_capacity = paVar25->_M_allocated_capacity;
          }
          local_5a0 = pbVar17->_M_string_length;
          (pbVar17->_M_dataplus)._M_p = (pointer)paVar25;
          pbVar17->_M_string_length = 0;
          (pbVar17->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&fname_part,_len,local_5a0);
          llama_model_load();
          uVar8 = (uint)local_558;
        }
        local_508 = CONCAT44(local_508._4_4_,uVar8 + 1);
        fprintf(_stderr,"%s: loading model part %d/%d from \'%s\'\n","llama_model_load",
                (ulong)(uVar8 + 1),local_578,fname_part._M_dataplus._M_p);
        std::ifstream::ifstream((ifstream *)&magic,(string *)&fname_part,_S_bin);
        std::ifstream::operator=(&fin,(ifstream *)&magic);
        std::ifstream::~ifstream((ifstream *)&magic);
        (**(code **)(local_228[0] + 0x18))(local_228,__s,0x100000);
        std::istream::seekg(&fin,local_4b8,0);
        llama_model_load();
        local_570 = 0;
        local_528 = 0;
        do {
          std::istream::read((char *)&fin,(long)&n_dims);
          std::istream::read((char *)&fin,(long)&length);
          std::istream::read((char *)&fin,(long)&ftype);
          iVar30 = 0xd;
          if ((abStack_218[*(long *)(_fin + -0x18)] & 2) == 0) {
            ne[0] = 1;
            ne[1] = 1;
            if (n_dims < 1) {
              iVar30 = 1;
            }
            else {
              iVar30 = 1;
              piVar28 = ne;
              lVar20 = 0;
              do {
                std::istream::read((char *)&fin,(long)piVar28);
                iVar30 = iVar30 * *piVar28;
                lVar20 = lVar20 + 1;
                piVar28 = piVar28 + 1;
              } while (lVar20 < n_dims);
            }
            _magic = (pointer)local_470;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&magic
                         ,(long)length,'\0');
            std::istream::read((char *)&fin,(long)_magic);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4e8,_magic,&local_579);
            iVar21 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                             *)local_568,&local_4e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
              operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((llama_model *)iVar21._M_node == local_538) {
              llama_model_load();
LAB_0010c097:
              iVar30 = 1;
            }
            else {
              sVar22 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&magic,"tok_embeddings",0,0xe);
              bVar36 = true;
              if (sVar22 == 0xffffffffffffffff) {
                sVar22 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&magic,"layers",0,6);
                if (sVar22 == 0xffffffffffffffff) {
                  sVar22 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&magic,"output",0,6);
                  bVar36 = sVar22 == 0xffffffffffffffff;
                }
                else {
                  sVar22 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&magic,"attention.wo.weight",0,0x13);
                  if (sVar22 == 0xffffffffffffffff) {
                    sVar22 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&magic,"feed_forward.w2.weight",0,0x16);
                    bVar36 = sVar22 != 0xffffffffffffffff;
                  }
                }
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4e8,_magic,&local_579);
              ppgVar16 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)local_568,&local_4e8);
              pgVar15 = *ppgVar16;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
                operator_delete(local_4e8._M_dataplus._M_p,
                                local_4e8.field_2._M_allocated_capacity + 1);
              }
              if (n_dims != 1) {
                iVar9 = ggml_nelements(pgVar15);
                if (iVar9 / (int)local_578 == iVar30) goto LAB_0010bbd3;
                llama_model_load();
                goto LAB_0010c097;
              }
              iVar9 = ggml_nelements(pgVar15);
              if (iVar9 != iVar30) {
                llama_model_load();
                goto LAB_0010c097;
              }
LAB_0010bbd3:
              uVar8 = pgVar15->ne[0];
              uVar23 = (ulong)uVar8;
              if (n_dims == 1) {
                if ((uVar8 != ne[0]) || (pgVar15->ne[1] != ne[1])) {
                  uVar24 = (ulong)(uint)pgVar15->ne[1];
                  goto LAB_0010c012;
                }
              }
              else if (bVar36) {
                if (((int)((long)(int)uVar8 / (long)(int)local_578) != ne[0]) ||
                   (pgVar15->ne[1] != ne[1])) {
                  uVar24 = (ulong)(uint)pgVar15->ne[1];
                  uVar23 = (long)(int)uVar8 / (long)(int)local_578 & 0xffffffff;
LAB_0010c012:
                  fprintf(_stderr,
                          "%s: tensor \'%s\' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n"
                          ,"llama_model_load",_magic,uVar23,uVar24,(ulong)ne & 0xffffffff,
                          (ulong)(uint)ne[1]);
                  goto LAB_0010c097;
                }
              }
              else if ((uVar8 != ne[0]) || (pgVar15->ne[1] / (int)local_578 != ne[1])) {
                uVar24 = (long)pgVar15->ne[1] / (long)(int)local_578 & 0xffffffff;
                goto LAB_0010c012;
              }
              if (3 < (ulong)(uint)ftype) {
                fprintf(_stderr,"%s: unknown ftype %d in model file\n","llama_model_load");
                goto LAB_0010c097;
              }
              sVar18 = ggml_type_size(*(ggml_type *)(&DAT_00133080 + (ulong)(uint)ftype * 4));
              uVar23 = sVar18 * (long)iVar30;
              if ((n_dims == 1) || ((int)local_578 == 1)) {
                iVar30 = ggml_blck_size(pgVar15->type);
                sVar18 = ggml_nbytes(pgVar15);
                _Var35._M_p = _magic;
                __stream = _stderr;
                if (uVar23 / (ulong)(long)iVar30 != sVar18) {
                  sVar18 = ggml_nbytes(pgVar15);
                  goto LAB_0010c060;
                }
                if ((float)local_558 == 0.0) {
                  pvVar5 = pgVar15->data;
                  ggml_nbytes(pgVar15);
                  std::istream::read((char *)&fin,(long)pvVar5);
                }
                else {
                  sVar18 = ggml_nbytes(pgVar15);
                  std::istream::seekg((long)&fin,(_Ios_Seekdir)sVar18);
                }
                uVar23 = ggml_nbytes(pgVar15);
              }
              else {
                iVar30 = ggml_blck_size(pgVar15->type);
                sVar18 = ggml_nbytes(pgVar15);
                _Var35._M_p = _magic;
                __stream = _stderr;
                if (uVar23 / (ulong)(long)iVar30 != sVar18 / local_578) {
                  sVar18 = ggml_nbytes(pgVar15);
                  sVar18 = sVar18 / local_578;
LAB_0010c060:
                  fprintf(__stream,
                          "%s: tensor \'%s\' has wrong size in model file: got %zu, expected %zu\n",
                          "llama_model_load",_Var35._M_p,sVar18,uVar23);
                  goto LAB_0010c097;
                }
                iVar30 = pgVar15->ne[0];
                if (bVar36) {
                  iVar7 = ne[0];
                  iVar9 = ggml_blck_size(pgVar15->type);
                  sVar18 = ggml_type_size(pgVar15->type);
                  if (0 < ne[1]) {
                    iVar27 = iVar7 * (int)(float)local_558;
                    lVar32 = 0;
                    lVar20 = 0;
                    do {
                      iVar12 = ggml_blck_size(pgVar15->type);
                      sVar19 = ggml_type_size(pgVar15->type);
                      std::istream::read((char *)&fin,
                                         (long)pgVar15->data +
                                         lVar32 + sVar19 * (long)(iVar27 / iVar12));
                      lVar20 = lVar20 + 1;
                      lVar32 = lVar32 + sVar18 * (long)(iVar30 / iVar9);
                    } while (lVar20 < ne[1]);
                  }
                }
                else {
                  iVar7 = ne[1];
                  iVar9 = ggml_blck_size(pgVar15->type);
                  sVar18 = ggml_type_size(pgVar15->type);
                  if (0 < ne[1]) {
                    lVar20 = sVar18 * (long)(iVar30 / iVar9);
                    lVar32 = (iVar7 * (int)(float)local_558) * lVar20;
                    lVar34 = 0;
                    do {
                      std::istream::read((char *)&fin,(long)pgVar15->data + lVar32);
                      lVar34 = lVar34 + 1;
                      lVar32 = lVar32 + lVar20;
                    } while (lVar34 < ne[1]);
                  }
                }
                sVar18 = ggml_nbytes(pgVar15);
                uVar23 = sVar18 / local_578;
              }
              local_528 = local_528 + uVar23;
              uVar8 = (int)local_570 + 1;
              local_570 = (ulong)uVar8;
              iVar30 = 0;
              if ((uVar8 & 7) == 0) {
                fputc(0x2e,_stderr);
                fflush(_stderr);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_magic != local_470) {
              operator_delete(_magic,local_470[0]._M_allocated_capacity + 1);
            }
          }
        } while (iVar30 == 0);
        if (iVar30 == 0xd) {
          llama_model_load();
          std::ifstream::close();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fname_part._M_dataplus._M_p != &fname_part.field_2) {
          operator_delete(fname_part._M_dataplus._M_p,fname_part.field_2._M_allocated_capacity + 1);
        }
        uVar23 = local_4c8 & 0xffffffff;
        piVar26 = (int32_t *)(local_508 & 0xffffffff);
      } while (iVar30 == 0xd);
      bVar36 = (int)local_578 <= (int)local_558;
      goto LAB_0010c135;
    }
    llama_model_load();
  }
  else {
    llama_model_load();
  }
  bVar36 = false;
LAB_0010c135:
  std::ifstream::~ifstream(&fin);
  operator_delete(__s,0x100000);
  return bVar36;
}

Assistant:

bool llama_model_load(const std::string & fname, llama_model & model, gpt_vocab & vocab, int n_ctx) {
    fprintf(stderr, "%s: loading model from '%s' - please wait ...\n", __func__, fname.c_str());

    std::vector<char> f_buf(1024*1024);

    auto fin = std::ifstream(fname, std::ios::binary);
    fin.rdbuf()->pubsetbuf(f_buf.data(), f_buf.size());
    if (!fin) {
        fprintf(stderr, "%s: failed to open '%s'\n", __func__, fname.c_str());
        return false;
    }

    // verify magic
    {
        uint32_t magic;
        fin.read((char *) &magic, sizeof(magic));
        if (magic != 0x67676d6c) {
            fprintf(stderr, "%s: invalid model file '%s' (bad magic)\n", __func__, fname.c_str());
            return false;
        }
    }

    int n_ff = 0;
    int n_parts = 0;

    // load hparams
    {
        auto & hparams = model.hparams;

        fin.read((char *) &hparams.n_vocab, sizeof(hparams.n_vocab));
        //fin.read((char *) &hparams.n_ctx,   sizeof(hparams.n_ctx));
        fin.read((char *) &hparams.n_embd,  sizeof(hparams.n_embd));
        fin.read((char *) &hparams.n_mult,  sizeof(hparams.n_mult));
        fin.read((char *) &hparams.n_head,  sizeof(hparams.n_head));
        fin.read((char *) &hparams.n_layer, sizeof(hparams.n_layer));
        fin.read((char *) &hparams.n_rot,   sizeof(hparams.n_rot));
        fin.read((char *) &hparams.f16,     sizeof(hparams.f16));

        hparams.n_ctx = n_ctx;

        n_ff = ((2*(4*hparams.n_embd)/3 + hparams.n_mult - 1)/hparams.n_mult)*hparams.n_mult;
        n_parts = LLAMA_N_PARTS.at(hparams.n_embd);

        // fprintf(stderr, "%s: n_vocab = %d\n", __func__, hparams.n_vocab);
        // fprintf(stderr, "%s: n_ctx   = %d\n", __func__, hparams.n_ctx);
        // fprintf(stderr, "%s: n_embd  = %d\n", __func__, hparams.n_embd);
        // fprintf(stderr, "%s: n_mult  = %d\n", __func__, hparams.n_mult);
        // fprintf(stderr, "%s: n_head  = %d\n", __func__, hparams.n_head);
        // fprintf(stderr, "%s: n_layer = %d\n", __func__, hparams.n_layer);
        // fprintf(stderr, "%s: n_rot   = %d\n", __func__, hparams.n_rot);
        // fprintf(stderr, "%s: f16     = %d\n", __func__, hparams.f16);
        // fprintf(stderr, "%s: n_ff    = %d\n", __func__, n_ff);
        // fprintf(stderr, "%s: n_parts = %d\n", __func__, n_parts);
    }

    // load vocab
    {
        const int32_t n_vocab = model.hparams.n_vocab;

        if (n_vocab != model.hparams.n_vocab) {
            fprintf(stderr, "%s: invalid model file '%s' (bad vocab size %d != %d)\n",
                    __func__, fname.c_str(), n_vocab, model.hparams.n_vocab);
            return false;
        }

        std::string word;
        for (int i = 0; i < n_vocab; i++) {
            uint32_t len;
            fin.read((char *) &len, sizeof(len));

            word.resize(len);
            fin.read((char *) word.data(), len);

            vocab.token_to_id[word] = i;
            vocab.id_to_token[i] = word;

            //if (i < 30000) {
            //    fprintf(stderr, "%s: vocab[%d] = '%s'\n", __func__, i, word.c_str());
            //}
        }
    }

    // for the big tensors, we have the option to store the data in 16-bit floats or quantized
    // in order to save memory and also to speed up the computation
    ggml_type wtype = GGML_TYPE_COUNT;
    switch (model.hparams.f16) {
        case 0: wtype = GGML_TYPE_F32;  break;
        case 1: wtype = GGML_TYPE_F16;  break;
        case 2: wtype = GGML_TYPE_Q4_0; break;
        case 3: wtype = GGML_TYPE_Q4_1; break;
        default:
                {
                    fprintf(stderr, "%s: invalid model file '%s' (bad f16 value %d)\n",
                            __func__, fname.c_str(), model.hparams.f16);
                    return false;
                }
    }

    const ggml_type wtype2 = GGML_TYPE_F32;

    auto & ctx = model.ctx;

    size_t ctx_size = 0;

    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;
        const int n_vocab = hparams.n_vocab;

        ctx_size += n_embd*n_vocab*ggml_type_sizef(wtype); // tok_embeddings

        ctx_size += n_embd*ggml_type_sizef(GGML_TYPE_F32); // norm

        ctx_size += n_embd*n_vocab*ggml_type_sizef(wtype); // output

        ctx_size += n_layer*(n_embd*ggml_type_sizef(GGML_TYPE_F32)); // attention_norm

        ctx_size += n_layer*(n_embd*n_embd*ggml_type_sizef(wtype)); // wq
        ctx_size += n_layer*(n_embd*n_embd*ggml_type_sizef(wtype)); // wk
        ctx_size += n_layer*(n_embd*n_embd*ggml_type_sizef(wtype)); // wv
        ctx_size += n_layer*(n_embd*n_embd*ggml_type_sizef(wtype)); // wo

        ctx_size += n_layer*(n_embd*ggml_type_sizef(GGML_TYPE_F32)); // ffn_norm

        ctx_size += n_layer*(n_ff*n_embd*ggml_type_sizef(wtype)); // w1
        ctx_size += n_layer*(n_ff*n_embd*ggml_type_sizef(wtype)); // w2
        ctx_size += n_layer*(n_ff*n_embd*ggml_type_sizef(wtype)); // w3

        ctx_size += n_ctx*n_layer*n_embd*ggml_type_sizef(GGML_TYPE_F32); // memory_k
        ctx_size += n_ctx*n_layer*n_embd*ggml_type_sizef(GGML_TYPE_F32); // memory_v

        ctx_size += (5 + 10*n_layer)*256; // object overhead

        fprintf(stderr, "%s: ggml ctx size = %6.2f MB\n", __func__, ctx_size/(1024.0*1024.0));
    }

    // create the ggml context
    {
        struct ggml_init_params params = {
            /*.mem_size   =*/ ctx_size,
            /*.mem_buffer =*/ NULL,
        };

        model.ctx = ggml_init(params);
        if (!model.ctx) {
            fprintf(stderr, "%s: ggml_init() failed\n", __func__);
            return false;
        }
    }

    // prepare memory for the weights
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;
        const int n_vocab = hparams.n_vocab;

        model.layers.resize(n_layer);

        model.tok_embeddings = ggml_new_tensor_2d(ctx, wtype, n_embd, n_vocab);

        model.norm   = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);
        model.output = ggml_new_tensor_2d(ctx, wtype,         n_embd, n_vocab);

        // map by name
        model.tensors["tok_embeddings.weight"] = model.tok_embeddings;

        model.tensors["norm.weight"]   = model.norm;
        model.tensors["output.weight"] = model.output;

        for (int i = 0; i < n_layer; ++i) {
            auto & layer = model.layers[i];

            layer.attention_norm = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);

            layer.wq = ggml_new_tensor_2d(ctx, wtype, n_embd, n_embd);
            layer.wk = ggml_new_tensor_2d(ctx, wtype, n_embd, n_embd);
            layer.wv = ggml_new_tensor_2d(ctx, wtype, n_embd, n_embd);
            layer.wo = ggml_new_tensor_2d(ctx, wtype, n_embd, n_embd);

            layer.ffn_norm = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);

            layer.w1 = ggml_new_tensor_2d(ctx, wtype, n_embd,   n_ff);
            layer.w2 = ggml_new_tensor_2d(ctx, wtype,   n_ff, n_embd);
            layer.w3 = ggml_new_tensor_2d(ctx, wtype, n_embd,   n_ff);

            // map by name
            model.tensors["layers." + std::to_string(i) + ".attention_norm.weight"] = layer.attention_norm;

            model.tensors["layers." + std::to_string(i) + ".attention.wq.weight"] = layer.wq;
            model.tensors["layers." + std::to_string(i) + ".attention.wk.weight"] = layer.wk;
            model.tensors["layers." + std::to_string(i) + ".attention.wv.weight"] = layer.wv;
            model.tensors["layers." + std::to_string(i) + ".attention.wo.weight"] = layer.wo;

            model.tensors["layers." + std::to_string(i) + ".ffn_norm.weight"] = layer.ffn_norm;

            model.tensors["layers." + std::to_string(i) + ".feed_forward.w1.weight"] = layer.w1;
            model.tensors["layers." + std::to_string(i) + ".feed_forward.w2.weight"] = layer.w2;
            model.tensors["layers." + std::to_string(i) + ".feed_forward.w3.weight"] = layer.w3;
        }
    }

    // key + value memory
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;

        const int n_mem      = n_layer*n_ctx;
        const int n_elements = n_embd*n_mem;

        model.memory_k = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);
        model.memory_v = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);

        const size_t memory_size = ggml_nbytes(model.memory_k) + ggml_nbytes(model.memory_v);

        fprintf(stderr, "%s: memory_size = %8.2f MB, n_mem = %d\n", __func__, memory_size/1024.0/1024.0, n_mem);
    }

    const size_t file_offset = fin.tellg();

    fin.close();

    std::vector<uint8_t> tmp;
    
    for (int i = 0; i < n_parts; ++i) {
        const int part_id = i;
        //const int part_id = n_parts - i - 1;

        std::string fname_part = fname;
        if (i > 0) {
            fname_part += "." + std::to_string(i);
        }

        fprintf(stderr, "%s: loading model part %d/%d from '%s'\n", __func__, i+1, n_parts, fname_part.c_str());

        fin = std::ifstream(fname_part, std::ios::binary);
        fin.rdbuf()->pubsetbuf(f_buf.data(), f_buf.size());
        fin.seekg(file_offset);

        // load weights
        {
            int n_tensors = 0;
            size_t total_size = 0;

            fprintf(stderr, "%s: ", __func__);

            while (true) {
                int32_t n_dims;
                int32_t length;
                int32_t ftype;

                fin.read(reinterpret_cast<char *>(&n_dims), sizeof(n_dims));
                fin.read(reinterpret_cast<char *>(&length), sizeof(length));
                fin.read(reinterpret_cast<char *>(&ftype),  sizeof(ftype));

                if (fin.eof()) {
                    break;
                }

                int32_t nelements = 1;
                int32_t ne[2] = { 1, 1 };
                for (int i = 0; i < n_dims; ++i) {
                    fin.read(reinterpret_cast<char *>(&ne[i]), sizeof(ne[i]));
                    nelements *= ne[i];
                }

                std::string name(length, 0);
                fin.read(&name[0], length);

                if (model.tensors.find(name.data()) == model.tensors.end()) {
                    fprintf(stderr, "%s: unknown tensor '%s' in model file\n", __func__, name.data());
                    return false;
                }

                // split_type = 0: split by columns
                // split_type = 1: split by rows
                int split_type = 0;

                // split_type = 0:
                // regex:
                //   - tok_embeddings.*
                //   - layers.*.attention.wo.weight
                //   - layers.*.feed_forward.w2.weight

                // split_type = 1:
                // regex:
                //   - output.*
                //   - layers.*.attention.wq.weight
                //   - layers.*.attention.wk.weight
                //   - layers.*.attention.wv.weight
                //   - layers.*.feed_forward.w1.weight
                //   - layers.*.feed_forward.w3.weight
                if (name.find("tok_embeddings") != std::string::npos) {
                    split_type = 0;
                } else if (name.find("layers") != std::string::npos) {
                    if (name.find("attention.wo.weight") != std::string::npos) {
                        split_type = 0;
                    } else if (name.find("feed_forward.w2.weight") != std::string::npos) {
                        split_type = 0;
                    } else {
                        split_type = 1;
                    }
                } else if (name.find("output") != std::string::npos) {
                    split_type = 1;
                }

                auto tensor = model.tensors[name.data()];

                if (n_dims == 1) {
                    if (ggml_nelements(tensor) != nelements) {
                        fprintf(stderr, "%s: tensor '%s' has wrong size in model file\n", __func__, name.data());
                        return false;
                    }
                } else {
                    if (ggml_nelements(tensor)/n_parts != nelements) {
                        fprintf(stderr, "%s: tensor '%s' has wrong size in model file\n", __func__, name.data());
                        return false;
                    }
                }

                if (n_dims == 1) {
                    if (tensor->ne[0] != ne[0] || tensor->ne[1] != ne[1]) {
                        fprintf(stderr, "%s: tensor '%s' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n",
                                __func__, name.data(), tensor->ne[0], tensor->ne[1], ne[0], ne[1]);
                        return false;
                    }
                } else {
                    if (split_type == 0) {
                        if (tensor->ne[0]/n_parts != ne[0] || tensor->ne[1] != ne[1]) {
                            fprintf(stderr, "%s: tensor '%s' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n",
                                    __func__, name.data(), tensor->ne[0]/n_parts, tensor->ne[1], ne[0], ne[1]);
                            return false;
                        }
                    } else {
                        if (tensor->ne[0] != ne[0] || tensor->ne[1]/n_parts != ne[1]) {
                            fprintf(stderr, "%s: tensor '%s' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n",
                                    __func__, name.data(), tensor->ne[0], tensor->ne[1]/n_parts, ne[0], ne[1]);
                            return false;
                        }
                    }
                }

                if (0) {
                    static const char * ftype_str[] = { "f32", "f16", "q4_0", "q4_1", };
                    fprintf(stderr, "%24s - [%5d, %5d], type = %6s, split = %d\n", name.data(), ne[0], ne[1], ftype_str[ftype], split_type);
                }

                size_t bpe = 0;

                switch (ftype) {
                    case 0: bpe = ggml_type_size(GGML_TYPE_F32);  break;
                    case 1: bpe = ggml_type_size(GGML_TYPE_F16);  break;
                    case 2: bpe = ggml_type_size(GGML_TYPE_Q4_0); assert(ne[0] % 64 == 0); break;
                    case 3: bpe = ggml_type_size(GGML_TYPE_Q4_1); assert(ne[0] % 64 == 0); break;
                    default:
                            {
                                fprintf(stderr, "%s: unknown ftype %d in model file\n", __func__, ftype);
                                return false;
                            }
                };

                if (n_dims == 1 || n_parts == 1) {
                    if ((nelements*bpe)/ggml_blck_size(tensor->type) != ggml_nbytes(tensor)) {
                        fprintf(stderr, "%s: tensor '%s' has wrong size in model file: got %zu, expected %zu\n",
                                __func__, name.data(), ggml_nbytes(tensor), nelements*bpe);
                        return false;
                    }

                    if (part_id == 0) {
                        fin.read(reinterpret_cast<char *>(tensor->data), ggml_nbytes(tensor));
                    } else {
                        fin.seekg(ggml_nbytes(tensor), std::ios::cur);
                    }

                    total_size += ggml_nbytes(tensor);
                } else {
                    if ((nelements*bpe)/ggml_blck_size(tensor->type) != ggml_nbytes(tensor)/n_parts) {
                        fprintf(stderr, "%s: tensor '%s' has wrong size in model file: got %zu, expected %zu\n",
                                __func__, name.data(), ggml_nbytes(tensor)/n_parts, nelements*bpe);
                        return false;
                    }

                    if (split_type == 0) {
                        const int np0 = ne[0];

                        const size_t row_size = (tensor->ne[0]/ggml_blck_size(tensor->type))*ggml_type_size(tensor->type);
                        assert(row_size == tensor->nb[1]);

                        for (int i1 = 0; i1 < ne[1]; ++i1) {
                            const size_t offset_row = i1*row_size;
                            const size_t offset = offset_row + ((part_id*np0)/ggml_blck_size(tensor->type))*ggml_type_size(tensor->type);
                            fin.read(reinterpret_cast<char *>(tensor->data) + offset, row_size/n_parts);
                        }
                    } else {
                        const int np1 = ne[1];

                        const size_t row_size = (tensor->ne[0]/ggml_blck_size(tensor->type))*ggml_type_size(tensor->type);

                        for (int i1 = 0; i1 < ne[1]; ++i1) {
                            const size_t offset_row = (i1 + part_id*np1)*row_size;
                            fin.read(reinterpret_cast<char *>(tensor->data) + offset_row, row_size);
                        }
                    }

                    total_size += ggml_nbytes(tensor)/n_parts;
                }

                //fprintf(stderr, "%42s - [%5d, %5d], type = %6s, %6.2f MB\n", name.data(), ne[0], ne[1], ftype == 0 ? "float" : "f16", ggml_nbytes(tensor)/1024.0/1024.0);
                if (++n_tensors % 8 == 0) {
                    fprintf(stderr, ".");
                    fflush(stderr);
                }
            }

            fprintf(stderr, " done\n");

            fprintf(stderr, "%s: model size = %8.2f MB / num tensors = %d\n", __func__, total_size/1024.0/1024.0, n_tensors);
        }

        fin.close();
    }

    return true;
}